

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  bool bVar1;
  string makefileName;
  string generator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_dataplus._M_p._0_1_ = 0x22;
  local_80._M_dataplus._M_p._0_1_ = 0x22;
  cmStrCat<char,std::__cxx11::string_const&,char>
            (__return_storage_ptr__,(char *)&local_40,make,(char *)&local_80);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_40);
  bVar1 = std::operator==(&local_40,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath(&local_80,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::operator+(&local_a0,&local_80,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a0);
    std::operator+(&local_60,", \"",target);
    std::operator+(&local_a0,&local_60,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==(&local_40,"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath(&local_80,makefile);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_a0,&local_80,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator+(&local_60,", \"",target);
      std::operator+(&local_a0,&local_60,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      bVar1 = std::operator==(&local_40,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&local_80);
      }
      else {
        cmSystemTools::ConvertToOutputPath(&local_a0,makefile);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_a0,&local_80,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator+(&local_60,", \"",target);
      std::operator+(&local_a0,&local_60,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}